

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismaticJoint.cpp
# Opt level: O1

void __thiscall iDynTree::PrismaticJoint::PrismaticJoint(PrismaticJoint *this,PrismaticJoint *other)

{
  LinkIndex LVar1;
  double dVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  (this->super_MovableJointImpl1).super_IJoint._vptr_IJoint =
       (_func_int **)&PTR__PrismaticJoint_001854b0;
  LVar1 = other->link2;
  this->link1 = other->link1;
  this->link2 = LVar1;
  iDynTree::Transform::Transform(&this->link1_X_link2_at_rest,&other->link1_X_link2_at_rest);
  iDynTree::Axis::Axis(&this->translation_axis_wrt_link1,&other->translation_axis_wrt_link1);
  this->m_hasPosLimits = other->m_hasPosLimits;
  dVar2 = other->m_maxPos;
  this->m_minPos = other->m_minPos;
  this->m_maxPos = dVar2;
  this->m_joint_dynamics_type = other->m_joint_dynamics_type;
  dVar2 = other->m_static_friction;
  this->m_damping = other->m_damping;
  this->m_static_friction = dVar2;
  iDynTree::Transform::Transform(&this->link1_X_link2);
  iDynTree::Transform::Transform(&this->link2_X_link1);
  (this->S_link2_link1).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3
  .m_data[1] = 0.0;
  (this->S_link2_link1).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3
  .m_data[2] = 0.0;
  (this->S_link2_link1).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
  m_data[2] = 0.0;
  (this->S_link2_link1).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3
  .m_data[0] = 0.0;
  (this->S_link2_link1).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
  m_data[0] = 0.0;
  (this->S_link2_link1).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
  m_data[1] = 0.0;
  (this->S_link1_link2).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3
  .m_data[1] = 0.0;
  (this->S_link1_link2).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3
  .m_data[2] = 0.0;
  (this->S_link1_link2).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
  m_data[2] = 0.0;
  (this->S_link1_link2).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3
  .m_data[0] = 0.0;
  (this->S_link1_link2).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
  m_data[0] = 0.0;
  (this->S_link1_link2).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
  m_data[1] = 0.0;
  iVar3 = (*(other->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x16])(other);
  (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x15])
            (this,CONCAT44(extraout_var,iVar3));
  iVar3 = (*(other->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x18])(other);
  (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x17])
            (this,CONCAT44(extraout_var_00,iVar3));
  resetAxisBuffers(this);
  resetBuffers(this,0.0);
  return;
}

Assistant:

PrismaticJoint::PrismaticJoint(const PrismaticJoint& other):
                             link1(other.link1), link2(other.link2),
                             link1_X_link2_at_rest(other.link1_X_link2_at_rest),
                             translation_axis_wrt_link1(other.translation_axis_wrt_link1),
                             m_hasPosLimits(other.m_hasPosLimits),
                             m_minPos(other.m_minPos), m_maxPos(other.m_maxPos),
                             m_joint_dynamics_type(other.m_joint_dynamics_type),
                             m_damping(other.m_damping), m_static_friction(other.m_static_friction)
{
    this->setPosCoordsOffset(other.getPosCoordsOffset());
    this->setDOFsOffset(other.getDOFsOffset());

    this->resetAxisBuffers();
    this->resetBuffers(0);
}